

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 674_longestContIncSubseq.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  initializer_list<int> __l;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> v;
  int local_18 [4];
  
  local_18[0] = 1;
  local_18[1] = 3;
  local_18[2] = 5;
  local_18[3] = 7;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,&local_31);
  iVar1 = findLengthOfLCIS(&v);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main()
{
	vector<int> v={1,3,5,7};
	cout<<findLengthOfLCIS(v)<<endl;
}